

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O2

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::
_dtFromPseudoVarWithIntRangesType<yactfr::VariantWithUnsignedIntegerSelectorType,unsigned_long_long>
          (DtFromPseudoRootDtConverter *this,PseudoVarWithIntRangesType *pseudoVarType,
          DataLocation *selLoc)

{
  _Head_base<0UL,_yactfr::internal::PseudoDt_*,_false> _Var1;
  long lVar2;
  unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  uVar3;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> _Var4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  __node_base_ptr in_RCX;
  uint uVar7;
  ulong uVar8;
  set<yactfr::IntegerRange<unsigned_long_long,_true>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
  ranges;
  Options opts;
  undefined1 local_120 [8];
  undefined1 local_118 [24];
  unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  local_100;
  _Rb_tree_header local_f8;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> local_d0;
  __node_base_ptr local_c8;
  PseudoErt *local_c0;
  PseudoVarWithIntRangesType *local_b8;
  undefined1 local_b0 [8];
  undefined1 local_a8 [24];
  undefined1 local_90 [56];
  _Rb_tree_header local_58;
  
  local_a8._16_8_ = (pointer)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_118._8_8_ =
       &(pseudoVarType->super_PseudoVarType).super_PseudoDt._posInScope.super_type.m_storage;
  uVar7 = 0;
  local_d0._M_head_impl = (DataType *)this;
  local_c8 = in_RCX;
  local_c0 = (PseudoErt *)selLoc;
  local_b8 = pseudoVarType;
  while( true ) {
    uVar8 = (ulong)uVar7;
    local_100._M_t.
    super___uniq_ptr_impl<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
    .super__Head_base<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_false>.
    _M_head_impl = (__uniq_ptr_data<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>,_true,_true>
                    )(__uniq_ptr_data<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>,_true,_true>
                      )selLoc;
    if ((ulong)((long)(((PseudoErt *)selLoc)->_name).super_type.m_storage.dummy_.aligner_ -
                *(long *)&(((PseudoErt *)selLoc)->_name).super_type >> 3) <= uVar8) break;
    pmVar5 = std::__detail::
             _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_118._8_8_,(key_type *)&local_100);
    *pmVar5 = uVar8;
    local_118._16_8_ = *(undefined8 *)&(((PseudoErt *)selLoc)->_name).super_type;
    local_f8._M_header._M_color = _S_red;
    local_f8._M_header._M_parent = (_Base_ptr)0x0;
    local_f8._M_node_count = 0;
    _Var1._M_head_impl =
         (((PseudoErt *)selLoc)->_pseudoSpecCtxType)._M_t.
         super___uniq_ptr_impl<yactfr::internal::PseudoDt,_std::default_delete<yactfr::internal::PseudoDt>_>
         ._M_t.
         super__Tuple_impl<0UL,_yactfr::internal::PseudoDt_*,_std::default_delete<yactfr::internal::PseudoDt>_>
         .super__Head_base<0UL,_yactfr::internal::PseudoDt_*,_false>._M_head_impl;
    p_Var6 = (_Rb_tree_node_base *)_Var1._M_head_impl[uVar8]._loc._colNumber;
    local_f8._M_header._M_left = &local_f8._M_header;
    local_f8._M_header._M_right = &local_f8._M_header;
    for (; p_Var6 != (_Rb_tree_node_base *)&_Var1._M_head_impl[uVar8]._loc;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      IntegerRange<unsigned_long_long,_true>::IntegerRange
                ((IntegerRange<unsigned_long_long,_true> *)local_90,
                 *(unsigned_long_long *)(p_Var6 + 1),(unsigned_long_long)p_Var6[1]._M_parent);
      std::
      _Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
      ::_M_insert_unique<yactfr::IntegerRange<unsigned_long_long,true>>
                ((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,true>,yactfr::IntegerRange<unsigned_long_long,true>,std::_Identity<yactfr::IntegerRange<unsigned_long_long,true>>,std::less<yactfr::IntegerRange<unsigned_long_long,true>>,std::allocator<yactfr::IntegerRange<unsigned_long_long,true>>>
                  *)&local_100,(IntegerRange<unsigned_long_long,_true> *)local_90);
    }
    lVar2 = *(long *)(local_118._16_8_ + uVar8 * 8);
    _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_120,(PseudoDt *)local_b8);
    std::_Rb_tree_header::_Rb_tree_header(&local_58,&local_f8);
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                *)local_90,
               (_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                *)(local_90 + 0x30));
    tryCloneAttrs((MapItem *)local_b0);
    std::
    make_unique<yactfr::VariantTypeOption<unsigned_long_long>const,boost::optional<std::__cxx11::string>const&,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_118,
               (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *)
               (lVar2 + 8),(IntegerRangeSet<unsigned_long_long,_true> *)local_120,
               (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_90);
    std::
    vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
    ::
    emplace_back<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>
              ((vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
                *)local_a8,
               (unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                *)local_118);
    selLoc = (DataLocation *)local_c0;
    std::
    unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
    ::~unique_ptr((unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                   *)local_118);
    std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
              ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
               local_b0);
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                 *)local_90);
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                 *)(local_90 + 0x30));
    if ((_Head_base<0UL,_const_yactfr::StructureType_*,_false>)local_120 !=
        (_Head_base<0UL,_const_yactfr::StructureType_*,_false>)0x0) {
      (*(((CompoundDataType *)local_120)->super_DataType)._vptr_DataType[1])();
    }
    std::
    _Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
    ::~_Rb_tree((_Rb_tree<yactfr::IntegerRange<unsigned_long_long,_true>,_yactfr::IntegerRange<unsigned_long_long,_true>,_std::_Identity<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::less<yactfr::IntegerRange<unsigned_long_long,_true>_>,_std::allocator<yactfr::IntegerRange<unsigned_long_long,_true>_>_>
                 *)&local_100);
    uVar7 = uVar7 + 1;
  }
  std::
  _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)local_118._8_8_);
  local_118._0_4_ = _S_black;
  tryCloneAttrs((MapItem *)local_90);
  std::
  make_unique<yactfr::VariantWithUnsignedIntegerSelectorType_const,int,std::vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>,yactfr::DataLocation,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            ((int *)&local_100,
             (vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
              *)local_118,(DataLocation *)local_a8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_c8);
  _Var4._M_head_impl = local_d0._M_head_impl;
  uVar3._M_t.
  super___uniq_ptr_impl<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  .super__Head_base<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_false>._M_head_impl
       = (__uniq_ptr_data<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>,_true,_true>
            )local_100;
  local_100._M_t.
  super___uniq_ptr_impl<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  .super__Head_base<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_false>._M_head_impl
       = (__uniq_ptr_data<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>,_true,_true>
          )(__uniq_ptr_impl<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
            )0x0;
  (local_d0._M_head_impl)->_vptr_DataType =
       (_func_int **)
       uVar3._M_t.
       super___uniq_ptr_impl<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
       ._M_t.
       super__Tuple_impl<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
       .super__Head_base<0UL,_const_yactfr::VariantWithUnsignedIntegerSelectorType_*,_false>.
       _M_head_impl;
  std::
  unique_ptr<const_yactfr::VariantWithUnsignedIntegerSelectorType,_std::default_delete<const_yactfr::VariantWithUnsignedIntegerSelectorType>_>
  ::~unique_ptr(&local_100);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_90);
  std::
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ::~vector((vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
             *)local_a8);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )_Var4._M_head_impl;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoVarWithIntRangesType(const PseudoVarWithIntRangesType& pseudoVarType,
                                                                            DataLocation&& selLoc)
{
    typename VarTypeT::Options opts;

    for (auto i = 0U; i < pseudoVarType.pseudoOpts().size(); ++i) {
        // currently being visited
        _current[&pseudoVarType] = i;

        const auto& pseudoOpt = pseudoVarType.pseudoOpts()[i];
        std::set<IntegerRange<IntRangeValueT>> ranges;

        for (auto& range : pseudoVarType.rangeSets()[i]) {
            ranges.insert(IntegerRange<IntRangeValueT> {
                static_cast<IntRangeValueT>(range.lower()),
                static_cast<IntRangeValueT>(range.upper())
            });
        }

        opts.push_back(VarTypeT::Option::create(pseudoOpt->name(),
                                                this->_dtFromPseudoDt(pseudoOpt->pseudoDt()),
                                                IntegerRangeSet<IntRangeValueT> {std::move(ranges)},
                                                this->_tryCloneAttrs(pseudoOpt->attrs())));
    }

    // not visited anymore
    _current.erase(&pseudoVarType);

    return VarTypeT::create(1, std::move(opts), std::move(selLoc),
                            this->_tryCloneAttrs(pseudoVarType.attrs()));
}